

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O3

bool __thiscall
jrtplib::RTPTCPTransmitter::ComesFromThisTransmitter(RTPTCPTransmitter *this,RTPAddress *addr)

{
  return false;
}

Assistant:

bool RTPTCPTransmitter::ComesFromThisTransmitter(const RTPAddress *addr)
{
	if (!m_init)
		return false;

	if (addr == 0)
		return false;
	
	MAINMUTEX_LOCK
	
	if (!m_created)
		return false;

	if (addr->GetAddressType() != RTPAddress::TCPAddress)
		return false;

	const RTPTCPAddress *pAddr = static_cast<const RTPTCPAddress *>(addr);
	bool v = false;

	JRTPLIB_UNUSED(pAddr);
	// TODO: for now, we're assuming that we can't just send to the same transmitter

	MAINMUTEX_UNLOCK
	return v;
}